

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O1

int cvRcheck3(CVodeMem cv_mem)

{
  sunrealtype *psVar1;
  sunrealtype *psVar2;
  int *piVar3;
  int *piVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  sunrealtype t;
  
  if (cv_mem->cv_taskc == 2) {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0]);
  }
  if (cv_mem->cv_taskc == 1) {
    dVar17 = cv_mem->cv_toutc;
    if (0.0 <= (dVar17 - cv_mem->cv_tn) * cv_mem->cv_h) {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(0x3ff0000000000000,cv_mem->cv_zn[0],cv_mem->cv_y);
    }
    else {
      cv_mem->cv_thi = dVar17;
      CVodeGetDky(cv_mem,dVar17,0,cv_mem->cv_y);
    }
  }
  iVar8 = (*cv_mem->cv_gfun)(cv_mem->cv_thi,cv_mem->cv_y,cv_mem->cv_ghi,cv_mem->cv_user_data);
  cv_mem->cv_nge = cv_mem->cv_nge + 1;
  iVar14 = -0xc;
  if (iVar8 == 0) {
    dVar17 = (ABS(cv_mem->cv_h) + ABS(cv_mem->cv_tn)) * cv_mem->cv_uround * 100.0;
    cv_mem->cv_ttol = dVar17;
    iVar8 = cv_mem->cv_nrtfn;
    uVar10 = (ulong)iVar8;
    if ((long)uVar10 < 1) {
      uVar15 = 0;
      bVar6 = true;
      bVar7 = true;
    }
    else {
      uVar12 = 0;
      bVar7 = false;
      bVar6 = false;
      uVar15 = 0;
      dVar18 = 0.0;
      do {
        if (cv_mem->cv_gactive[uVar12] != 0) {
          dVar20 = cv_mem->cv_ghi[uVar12];
          if ((dVar20 != 0.0) || (NAN(dVar20))) {
            dVar5 = cv_mem->cv_glo[uVar12];
            if ((((0.0 < dVar20) && (dVar5 < 0.0)) || ((dVar20 < 0.0 && (0.0 < dVar5)))) &&
               (((double)cv_mem->cv_rootdir[uVar12] * dVar5 <= 0.0 &&
                (dVar20 = ABS(dVar20 / (dVar20 - dVar5)), dVar18 < dVar20)))) {
              bVar7 = true;
              uVar15 = uVar12 & 0xffffffff;
              dVar18 = dVar20;
            }
          }
          else if ((double)cv_mem->cv_rootdir[uVar12] * cv_mem->cv_glo[uVar12] <= 0.0) {
            bVar6 = true;
          }
        }
        uVar12 = uVar12 + 1;
      } while (uVar10 != uVar12);
      bVar7 = !bVar7;
      bVar6 = !bVar6;
    }
    if (bVar7) {
      cv_mem->cv_trout = cv_mem->cv_thi;
      if (0 < iVar8) {
        psVar1 = cv_mem->cv_ghi;
        psVar2 = cv_mem->cv_grout;
        uVar15 = 0;
        do {
          psVar2[uVar15] = psVar1[uVar15];
          uVar15 = uVar15 + 1;
        } while (uVar10 != uVar15);
      }
      if ((bool)(iVar8 < 1 | bVar6)) {
        uVar9 = (uint)(bVar6 ^ 1);
      }
      else {
        piVar4 = cv_mem->cv_iroots;
        piVar3 = cv_mem->cv_gactive;
        lVar13 = 0;
        do {
          piVar4[lVar13] = 0;
          if (((piVar3[lVar13] != 0) && (cv_mem->cv_ghi[lVar13] == 0.0)) &&
             ((!NAN(cv_mem->cv_ghi[lVar13]) &&
              ((double)cv_mem->cv_rootdir[lVar13] * cv_mem->cv_glo[lVar13] <= 0.0)))) {
            piVar4[lVar13] = (uint)(cv_mem->cv_glo[lVar13] <= 0.0) * 2 + -1;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < cv_mem->cv_nrtfn);
        uVar9 = 1;
      }
    }
    else {
      dVar18 = cv_mem->cv_tlo;
      dVar20 = cv_mem->cv_thi;
      dVar19 = dVar20 - dVar18;
      dVar5 = ABS(dVar19);
      if (dVar17 < dVar5) {
        dVar22 = 1.0;
        dVar21 = 0.5;
        iVar8 = -1;
        iVar16 = 0;
        do {
          if (iVar8 == iVar16) {
            dVar22 = dVar22 * dVar21;
          }
          else {
            dVar22 = 1.0;
          }
          t = dVar20 - (dVar19 * cv_mem->cv_ghi[(int)uVar15]) /
                       (cv_mem->cv_ghi[(int)uVar15] - cv_mem->cv_glo[(int)uVar15] * dVar22);
          if (ABS(t - dVar18) < dVar17 * 0.5) {
            uVar10 = -(ulong)(5.0 < dVar5 / dVar17);
            t = (double)(uVar10 & 0x3fb999999999999a | ~uVar10 & (ulong)(0.5 / (dVar5 / dVar17))) *
                dVar19 + dVar18;
          }
          if (ABS(dVar20 - t) < dVar17 * 0.5) {
            uVar10 = -(ulong)(5.0 < dVar5 / dVar17);
            t = (double)(uVar10 & 0xbfb999999999999a | ~uVar10 & (ulong)(-0.5 / (dVar5 / dVar17))) *
                dVar19 + dVar20;
          }
          CVodeGetDky(cv_mem,t,0,cv_mem->cv_y);
          iVar8 = (*cv_mem->cv_gfun)(t,cv_mem->cv_y,cv_mem->cv_grout,cv_mem->cv_user_data);
          cv_mem->cv_nge = cv_mem->cv_nge + 1;
          if (iVar8 != 0) {
            uVar9 = 0xfffffff4;
            goto LAB_0010f658;
          }
          iVar8 = cv_mem->cv_nrtfn;
          uVar10 = (ulong)iVar8;
          if ((long)uVar10 < 1) {
            bVar7 = true;
            bVar6 = true;
          }
          else {
            dVar17 = 0.0;
            uVar12 = 0;
            bVar6 = false;
            bVar7 = false;
            do {
              if (cv_mem->cv_gactive[uVar12] != 0) {
                dVar18 = cv_mem->cv_grout[uVar12];
                if ((dVar18 != 0.0) || (NAN(dVar18))) {
                  dVar20 = cv_mem->cv_glo[uVar12];
                  if ((((0.0 < dVar18) && (dVar20 < 0.0)) || ((dVar18 < 0.0 && (0.0 < dVar20)))) &&
                     (((double)cv_mem->cv_rootdir[uVar12] * dVar20 <= 0.0 &&
                      (dVar18 = ABS(dVar18 / (dVar18 - dVar20)), dVar17 < dVar18)))) {
                    bVar6 = true;
                    uVar15 = uVar12 & 0xffffffff;
                    dVar17 = dVar18;
                  }
                }
                else if ((double)cv_mem->cv_rootdir[uVar12] * cv_mem->cv_glo[uVar12] <= 0.0) {
                  bVar7 = true;
                }
              }
              uVar12 = uVar12 + 1;
            } while (uVar10 != uVar12);
            bVar6 = !bVar6;
            bVar7 = !bVar7;
          }
          if (bVar6) {
            if (!bVar7) {
              cv_mem->cv_thi = t;
              if (0 < iVar8) {
                psVar1 = cv_mem->cv_ghi;
                psVar2 = cv_mem->cv_grout;
                uVar15 = 0;
                do {
                  psVar1[uVar15] = psVar2[uVar15];
                  uVar15 = uVar15 + 1;
                } while (uVar10 != uVar15);
              }
              break;
            }
            cv_mem->cv_tlo = t;
            if (0 < iVar8) {
              psVar1 = cv_mem->cv_glo;
              psVar2 = cv_mem->cv_grout;
              uVar12 = 0;
              do {
                psVar1[uVar12] = psVar2[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            iVar11 = 2;
            dVar21 = 2.0;
            if (ABS(cv_mem->cv_thi - cv_mem->cv_tlo) <= cv_mem->cv_ttol) break;
          }
          else {
            cv_mem->cv_thi = t;
            if (0 < iVar8) {
              psVar1 = cv_mem->cv_ghi;
              psVar2 = cv_mem->cv_grout;
              uVar12 = 0;
              do {
                psVar1[uVar12] = psVar2[uVar12];
                uVar12 = uVar12 + 1;
              } while (uVar10 != uVar12);
            }
            iVar11 = 1;
            dVar21 = 0.5;
            if (ABS(cv_mem->cv_thi - cv_mem->cv_tlo) <= cv_mem->cv_ttol) break;
          }
          dVar18 = cv_mem->cv_tlo;
          dVar20 = cv_mem->cv_thi;
          dVar19 = dVar20 - dVar18;
          dVar5 = ABS(dVar19);
          dVar17 = cv_mem->cv_ttol;
          iVar8 = iVar16;
          iVar16 = iVar11;
        } while (dVar17 < dVar5);
      }
      cv_mem->cv_trout = cv_mem->cv_thi;
      uVar9 = 1;
      if (0 < cv_mem->cv_nrtfn) {
        piVar4 = cv_mem->cv_iroots;
        psVar1 = cv_mem->cv_ghi;
        psVar2 = cv_mem->cv_grout;
        piVar3 = cv_mem->cv_gactive;
        lVar13 = 0;
        do {
          psVar2[lVar13] = psVar1[lVar13];
          piVar4[lVar13] = 0;
          if (piVar3[lVar13] != 0) {
            dVar17 = psVar1[lVar13];
            if (((dVar17 == 0.0) && (!NAN(dVar17))) &&
               ((double)cv_mem->cv_rootdir[lVar13] * cv_mem->cv_glo[lVar13] <= 0.0)) {
              piVar4[lVar13] = (uint)(cv_mem->cv_glo[lVar13] <= 0.0) * 2 + -1;
            }
            dVar18 = cv_mem->cv_glo[lVar13];
            if ((((0.0 < dVar17) && (dVar18 < 0.0)) || ((dVar17 < 0.0 && (0.0 < dVar18)))) &&
               ((double)cv_mem->cv_rootdir[lVar13] * dVar18 <= 0.0)) {
              piVar4[lVar13] = (uint)(dVar18 <= 0.0) * 2 + -1;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < cv_mem->cv_nrtfn);
      }
    }
LAB_0010f658:
    if (uVar9 != 0xfffffff4) {
      uVar10 = (ulong)(uint)cv_mem->cv_nrtfn;
      if (0 < cv_mem->cv_nrtfn) {
        piVar4 = cv_mem->cv_gactive;
        lVar13 = 0;
        do {
          if ((piVar4[lVar13] == 0) &&
             ((cv_mem->cv_grout[lVar13] != 0.0 || (NAN(cv_mem->cv_grout[lVar13]))))) {
            piVar4[lVar13] = 1;
          }
          lVar13 = lVar13 + 1;
          uVar10 = (ulong)cv_mem->cv_nrtfn;
        } while (lVar13 < (long)uVar10);
      }
      cv_mem->cv_tlo = cv_mem->cv_trout;
      if (0 < (int)uVar10) {
        psVar1 = cv_mem->cv_glo;
        psVar2 = cv_mem->cv_grout;
        uVar15 = 0;
        do {
          psVar1[uVar15] = psVar2[uVar15];
          uVar15 = uVar15 + 1;
        } while ((uVar10 & 0xffffffff) != uVar15);
      }
      if (uVar9 == 0) {
        iVar14 = 0;
      }
      else {
        CVodeGetDky(cv_mem,cv_mem->cv_trout,0,cv_mem->cv_y);
        iVar14 = 1;
      }
    }
  }
  return iVar14;
}

Assistant:

static int cvRcheck3(CVodeMem cv_mem)
{
  int i, ier, retval;

  /* Set thi = tn or tout, whichever comes first; set y = y(thi). */
  if (cv_mem->cv_taskc == CV_ONE_STEP)
  {
    cv_mem->cv_thi = cv_mem->cv_tn;
    N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
  }
  if (cv_mem->cv_taskc == CV_NORMAL)
  {
    if ((cv_mem->cv_toutc - cv_mem->cv_tn) * cv_mem->cv_h >= ZERO)
    {
      cv_mem->cv_thi = cv_mem->cv_tn;
      N_VScale(ONE, cv_mem->cv_zn[0], cv_mem->cv_y);
    }
    else
    {
      cv_mem->cv_thi = cv_mem->cv_toutc;
      (void)CVodeGetDky(cv_mem, cv_mem->cv_thi, 0, cv_mem->cv_y);
    }
  }

  /* Set ghi = g(thi) and call cvRootfind to search (tlo,thi) for roots. */
  retval = cv_mem->cv_gfun(cv_mem->cv_thi, cv_mem->cv_y, cv_mem->cv_ghi,
                           cv_mem->cv_user_data);
  cv_mem->cv_nge++;
  if (retval != 0) { return (CV_RTFUNC_FAIL); }

  cv_mem->cv_ttol = (SUNRabs(cv_mem->cv_tn) + SUNRabs(cv_mem->cv_h)) *
                    cv_mem->cv_uround * HUNDRED;
  ier = cvRootfind(cv_mem);
  if (ier == CV_RTFUNC_FAIL) { return (CV_RTFUNC_FAIL); }
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    if (!cv_mem->cv_gactive[i] && cv_mem->cv_grout[i] != ZERO)
    {
      cv_mem->cv_gactive[i] = SUNTRUE;
    }
  }
  cv_mem->cv_tlo = cv_mem->cv_trout;
  for (i = 0; i < cv_mem->cv_nrtfn; i++)
  {
    cv_mem->cv_glo[i] = cv_mem->cv_grout[i];
  }

  /* If no root found, return CV_SUCCESS. */
  if (ier == CV_SUCCESS) { return (CV_SUCCESS); }

  /* If a root was found, interpolate to get y(trout) and return.  */
  (void)CVodeGetDky(cv_mem, cv_mem->cv_trout, 0, cv_mem->cv_y);
  return (RTFOUND);
}